

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedMap.c
# Opt level: O3

void rmlLinkedMapDestroy(void *self)

{
  rmlLinkedMapKeyValuePair_ *self_00;
  int64_t iVar1;
  
  if (self == (void *)0x0) {
    return;
  }
  while (iVar1 = rmlLinkedListGetLength(self), 0 < iVar1) {
    self_00 = (rmlLinkedMapKeyValuePair_ *)rmlLinkedListPop(self);
    rmlLinkedMapKeyValuePairDestroy(self_00);
  }
  rmlLinkedListDestroy(self);
  return;
}

Assistant:

void rmlLinkedMapDestroy(void *self) {
    if (self == NULL) {
        return;
    }

    while (rmlLinkedListGetLength(self) > 0) {
        struct rmlLinkedMapKeyValuePair_ *pair = rmlLinkedListPop(self);
        rmlLinkedMapKeyValuePairDestroy(pair);
    }

    RML_VERBOSE("Destroy LinkedMap(0x%llx), also destroy the related LinkedList", (uint64_t) self)
    rmlLinkedListDestroy(self);
}